

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_intrinsic_sse4.h
# Opt level: O0

void obmc_variance_w4(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse,int *sum,
                     int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int32_t iVar4;
  long in_RCX;
  long in_RDX;
  int iVar5;
  longlong in_RSI;
  long in_RDI;
  int32_t *in_R8;
  int32_t *in_R9;
  undefined1 auVar7 [16];
  __m128i alVar8;
  __m128i v_val_d;
  __m128i v_d;
  __m128i v_sqrdiff_d;
  __m128i v_rdiff_d;
  __m128i v_diff_d;
  __m128i v_pm_d;
  __m128i v_p_d;
  __m128i v_w_d;
  __m128i v_m_d;
  __m128i v_p_b;
  __m128i v_sse_d;
  __m128i v_sum_d;
  int n;
  int pre_step;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_138 [16];
  undefined4 local_120;
  undefined8 local_f0;
  undefined4 local_58;
  longlong lVar6;
  
  iVar5 = (int)in_RSI;
  local_120 = 0;
  local_138 = ZEXT816(0);
  auVar1 = ZEXT816(0);
  local_f0 = in_RDI;
  do {
    auVar7 = auVar1;
    alVar8 = xx_loadl_32((void *)(local_f0 + local_120));
    local_58 = auVar7._0_4_;
    auVar7 = vpmovzxbd_avx(ZEXT416(local_58));
    auVar7 = vpmaddwd_avx(auVar7,*(undefined1 (*) [16])(in_RCX + (long)local_120 * 4));
    auVar7 = vpsubd_avx(*(undefined1 (*) [16])(in_RDX + (long)local_120 * 4),auVar7);
    local_1a8 = auVar7._0_8_;
    uStack_1a0 = auVar7._8_8_;
    v_val_d[1] = in_RSI;
    v_val_d[0] = 0xc;
    lVar6 = 0xc;
    xx_roundn_epi32(v_val_d,(int)alVar8[1]);
    auVar3._8_8_ = uStack_1a0;
    auVar3._0_8_ = local_1a8;
    auVar7._8_8_ = uStack_1a0;
    auVar7._0_8_ = local_1a8;
    auVar7 = vpmulld_avx(auVar3,auVar7);
    auVar2._8_8_ = uStack_1a0;
    auVar2._0_8_ = local_1a8;
    local_138 = vpaddd_avx(local_138,auVar2);
    auVar1 = vpaddd_avx(auVar1,auVar7);
    local_120 = local_120 + 4;
    if (local_120 % 4 == 0) {
      local_f0 = local_f0 + (iVar5 + -4);
    }
  } while (local_120 < (int)v_sqrdiff_d[1] * 4);
  alVar8[1] = in_RSI;
  alVar8[0] = lVar6;
  iVar4 = xx_hsum_epi32_si32(alVar8);
  *in_R9 = iVar4;
  v_d[1] = in_RSI;
  v_d[0] = lVar6;
  iVar4 = xx_hsum_epi32_si32(v_d);
  *in_R8 = iVar4;
  return;
}

Assistant:

static inline void obmc_variance_w4(const uint8_t *pre, const int pre_stride,
                                    const int32_t *wsrc, const int32_t *mask,
                                    unsigned int *const sse, int *const sum,
                                    const int h) {
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p_b = xx_loadl_32(pre + n);
    const __m128i v_m_d = _mm_load_si128((const __m128i *)(mask + n));
    const __m128i v_w_d = _mm_load_si128((const __m128i *)(wsrc + n));

    const __m128i v_p_d = _mm_cvtepu8_epi32(v_p_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_rdiff_d = xx_roundn_epi32(v_diff_d, 12);
    const __m128i v_sqrdiff_d = _mm_mullo_epi32(v_rdiff_d, v_rdiff_d);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}